

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyEmFromI(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  
  if (node != (Node *)0x0) {
    do {
      if (node->tag != (Dict *)0x0) {
        TVar1 = node->tag->id;
        if (TVar1 == TidyTag_I) {
          TVar1 = TidyTag_EM;
        }
        else {
          if (TVar1 != TidyTag_B) goto LAB_00136f9d;
          TVar1 = TidyTag_STRONG;
        }
        RenameElem(doc,node,TVar1);
      }
LAB_00136f9d:
      if (node->content != (Node *)0x0) {
        prvTidyEmFromI(doc,node->content);
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(EmFromI)( TidyDocImpl* doc, Node* node )
{
    while (node)
    {
        if ( nodeIsI(node) )
            RenameElem( doc, node, TidyTag_EM );
        else if ( nodeIsB(node) )
            RenameElem( doc, node, TidyTag_STRONG );

        if ( node->content )
            TY_(EmFromI)( doc, node->content );

        node = node->next;
    }
}